

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

void xmlSchemaPostRun(xmlSchemaValidCtxtPtr vctxt)

{
  xmlSchemaValidCtxtPtr vctxt_local;
  
  if ((vctxt->xsiAssemble != 0) && (vctxt->schema != (xmlSchemaPtr)0x0)) {
    xmlSchemaFree(vctxt->schema);
    vctxt->schema = (xmlSchemaPtr)0x0;
  }
  xmlSchemaClearValidCtxt(vctxt);
  return;
}

Assistant:

static void
xmlSchemaPostRun(xmlSchemaValidCtxtPtr vctxt) {
    if (vctxt->xsiAssemble) {
	if (vctxt->schema != NULL) {
	    xmlSchemaFree(vctxt->schema);
	    vctxt->schema = NULL;
	}
    }
    xmlSchemaClearValidCtxt(vctxt);
}